

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O2

sexp sexp_bignum_sqrt(sexp ctx,sexp a,sexp_conflict *rem_out)

{
  sexp *ppsVar1;
  sexp psVar2;
  double dVar3;
  sexp local_88;
  sexp tmp;
  sexp rem;
  sexp tmpa;
  undefined1 *local_68;
  sexp_gc_var_t *local_60;
  sexp_gc_var_t local_58;
  sexp_gc_var_t local_48;
  sexp_gc_var_t local_38;
  
  local_68 = (undefined1 *)&local_88;
  local_88 = (sexp)0x43e;
  rem = (sexp)&DAT_0000043e;
  tmp = (sexp)&DAT_0000043e;
  tmpa = (sexp)&DAT_0000043e;
  if ((((ulong)a & 3) != 0) || (a->tag != 0xc)) {
    psVar2 = sexp_type_exception(ctx,(sexp)0x0,0xc,a);
    return psVar2;
  }
  local_38.next = (sexp_gc_var_t *)&local_68;
  local_60 = (ctx->value).context.saves;
  local_38.var = &rem;
  local_48.next = &local_38;
  local_48.var = &tmp;
  local_58.next = &local_48;
  local_58.var = &tmpa;
  (ctx->value).context.saves = &local_58;
  ppsVar1 = &local_88;
  if ((a->tag != 0xc) || (ppsVar1 = &local_88, -1 < (a->value).flonum_bits[0])) goto LAB_0011a472;
  tmpa = sexp_copy_bignum(ctx,(sexp)0x0,a,0);
  a = tmpa;
  ppsVar1 = (sexp *)local_68;
  if (((ulong)tmpa & 3) == 0) {
    if (tmpa->tag == 0xc) {
      (tmpa->value).flonum_bits[0] = -(tmpa->value).flonum_bits[0];
      goto LAB_0011a472;
    }
    if (tmpa->tag == 0xb) {
      (tmpa->value).stack.length = (tmpa->value).stack.length ^ 0x8000000000000000;
      goto LAB_0011a472;
    }
  }
  if (((ulong)tmpa & 1) != 0) {
    a = (sexp)(1 - ((ulong)tmpa & 0xfffffffffffffffe));
  }
LAB_0011a472:
  local_68 = (undefined1 *)ppsVar1;
  dVar3 = sexp_bignum_to_double(a);
  local_88 = sexp_make_flonum(ctx,dVar3);
  local_88 = sexp_inexact_sqrt(ctx,(sexp)0x0,1,local_88);
  if ((((ulong)local_88 & 3) == 0) && (local_88->tag == 0xb)) {
    dVar3 = (local_88->value).flonum;
    if (1073741824.0 < dVar3) {
      if (dVar3 < INFINITY) {
        local_88 = sexp_double_to_bignum(ctx,dVar3);
      }
      else {
        local_88 = sexp_bignum_sqrt_estimate(ctx,a);
      }
      do {
        rem = sexp_mul(ctx,local_88,local_88);
        tmp = sexp_sub(ctx,a,rem);
        rem = tmp;
        if (((ulong)tmp & 1) == 0) {
          if (((((ulong)tmp & 2) != 0) || (tmp->tag != 0xc)) || (-1 < (tmp->value).flonum_bits[0]))
          {
LAB_0011a61e:
            if (((((ulong)tmp & 3) != 0) || (tmp->tag != 0xb)) ||
               (0.0 < (tmp->value).flonum || (tmp->value).flonum == 0.0)) {
              tmp = sexp_sub(ctx,tmp,(sexp)&DAT_00000003);
              tmp = sexp_quotient(ctx,tmp,(sexp)&DAT_00000005);
              tmp = sexp_compare(ctx,tmp,local_88);
              if (((ulong)tmp & 1) == 0) {
                if (((((ulong)tmp & 2) == 0) && (tmp->tag == 0xc)) &&
                   ((tmp->value).flonum_bits[0] < '\0')) goto LAB_0011a56c;
              }
              else if ((long)tmp < 0) goto LAB_0011a56c;
              if (((((ulong)tmp & 3) == 0) && (tmp->tag == 0xb)) &&
                 ((tmp->value).flonum <= 0.0 && (tmp->value).flonum != 0.0)) goto LAB_0011a56c;
            }
          }
        }
        else if (-1 < (long)tmp) goto LAB_0011a61e;
        tmp = sexp_quotient(ctx,a,local_88);
        local_88 = sexp_add(ctx,local_88,tmp);
        local_88 = sexp_quotient(ctx,local_88,(sexp)&DAT_00000005);
      } while( true );
    }
    psVar2 = sexp_double_to_bignum(ctx,dVar3);
    local_88 = sexp_bignum_normalize(psVar2);
  }
  tmp = sexp_mul(ctx,local_88,local_88);
  rem = sexp_sub(ctx,a,tmp);
LAB_0011a56c:
  psVar2 = sexp_bignum_normalize(rem);
  *rem_out = psVar2;
  (ctx->value).context.saves = local_60;
  psVar2 = sexp_bignum_normalize(local_88);
  return psVar2;
}

Assistant:

sexp sexp_bignum_sqrt (sexp ctx, sexp a, sexp* rem_out) {
  sexp_gc_var4(res, rem, tmp, tmpa);
  if (! sexp_bignump(a)) return sexp_type_exception(ctx, NULL, SEXP_BIGNUM, a);
  sexp_gc_preserve4(ctx, res, rem, tmp, tmpa);
  /* initial estimate via flonum, ignoring signs */
  if (sexp_exact_negativep(a)) {
    tmpa = sexp_copy_bignum(ctx, NULL, a, 0);
    a = tmpa;
    sexp_negate(a);
  }
  res = sexp_make_flonum(ctx, sexp_bignum_to_double(a));
  res = sexp_inexact_sqrt(ctx, NULL, 1, res);
  if (sexp_flonump(res) &&
      sexp_flonum_value(res) > SEXP_MAX_ACCURATE_FLONUM_SQRT) {
    if (isinf(sexp_flonum_value(res)))
      res = sexp_bignum_sqrt_estimate(ctx, a);
    else
      res = sexp_double_to_bignum(ctx, sexp_flonum_value(res));
  loop:                           /* until 0 <= a - res*res < 2*res + 1 */
    rem = sexp_mul(ctx, res, res);
    tmp = rem = sexp_sub(ctx, a, rem);
    if (!sexp_positivep(tmp)) goto adjust;
    tmp = sexp_sub(ctx, tmp, SEXP_ONE);
    tmp = sexp_quotient(ctx, tmp, SEXP_TWO);
    tmp = sexp_compare(ctx, tmp, res);
    if (sexp_positivep(tmp)) {
    adjust:
      tmp = sexp_quotient(ctx, a, res);
      res = sexp_add(ctx, res, tmp);
      res = sexp_quotient(ctx, res, SEXP_TWO);
      goto loop;
    }
  } else {
    if (sexp_flonump(res))
      res = sexp_bignum_normalize(sexp_double_to_bignum(ctx, sexp_flonum_value(res)));
    tmp = sexp_mul(ctx, res, res);
    rem = sexp_sub(ctx, a, tmp);
  }
  *rem_out = sexp_bignum_normalize(rem);
  sexp_gc_release4(ctx);
  return sexp_bignum_normalize(res);
}